

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintNestedDescriptors
          (Generator *this,Descriptor *containing_descriptor,StripPrintDescriptor print_mode)

{
  long lVar1;
  long lVar2;
  
  if (print_mode == kCreate) {
    if (0 < *(int *)(containing_descriptor + 0x70)) {
      lVar2 = 0;
      lVar1 = 0;
      do {
        PrintCreateDescriptor(this,(Descriptor *)(*(long *)(containing_descriptor + 0x38) + lVar2));
        lVar1 = lVar1 + 1;
        lVar2 = lVar2 + 0x88;
      } while (lVar1 < *(int *)(containing_descriptor + 0x70));
    }
  }
  else if (0 < *(int *)(containing_descriptor + 0x70)) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      PrintFindDescriptor(this,(Descriptor *)(*(long *)(containing_descriptor + 0x38) + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 0x88;
    } while (lVar1 < *(int *)(containing_descriptor + 0x70));
  }
  return;
}

Assistant:

void Generator::PrintNestedDescriptors(const Descriptor& containing_descriptor,
                                       StripPrintDescriptor print_mode) const {
  if (print_mode == StripPrintDescriptor::kCreate) {
    for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
      PrintCreateDescriptor(*containing_descriptor.nested_type(i));
    }
  } else {
    for (int i = 0; i < containing_descriptor.nested_type_count(); ++i) {
      PrintFindDescriptor(*containing_descriptor.nested_type(i));
    }
  }
}